

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_EnumerateCallbackResult enumCallbackFilterSymLinks(void *_data,char *origdir,char *fname)

{
  undefined8 *puVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined1 *ptr;
  size_t sVar4;
  int iVar5;
  PHYSFS_ErrorCode PVar6;
  size_t sVar7;
  char *pcVar8;
  char *__s;
  undefined1 *puVar9;
  char *pcVar10;
  undefined1 auStack_a8 [8];
  undefined1 *local_a0;
  size_t local_98;
  char *local_90;
  PHYSFS_EnumerateCallbackResult local_84;
  char *pcStack_80;
  PHYSFS_EnumerateCallbackResult retval;
  char *path;
  size_t slen;
  char *trimmedDir;
  PHYSFS_Stat statbuf;
  char *arcfname;
  DirHandle *dh;
  SymlinkFilterData *data;
  char *fname_local;
  char *origdir_local;
  void *_data_local;
  
  puVar9 = auStack_a8;
  puVar1 = *(undefined8 **)((long)_data + 0x10);
  statbuf._32_8_ = *(undefined8 *)((long)_data + 0x18);
  local_90 = (char *)statbuf._32_8_;
  if (*(char *)statbuf._32_8_ == '/') {
    local_90 = (char *)(statbuf._32_8_ + 1);
  }
  slen = (size_t)local_90;
  local_98 = strlen(local_90);
  sVar7 = strlen(fname);
  pcVar8 = (char *)(local_98 + sVar7 + 2);
  if (pcVar8 < (char *)0x100) {
    puVar9 = auStack_a8 + -(local_98 + sVar7 + 0x19 & 0xfffffffffffffff0);
    local_a0 = puVar9;
  }
  else {
    local_a0 = (undefined1 *)0x0;
  }
  ptr = local_a0;
  path = pcVar8;
  *(undefined8 *)(puVar9 + -8) = 0x10a87b;
  __s = (char *)__PHYSFS_initSmallAlloc(ptr,(size_t)pcVar8);
  sVar4 = slen;
  pcVar8 = path;
  local_84 = PHYSFS_ENUM_OK;
  if (__s == (char *)0x0) {
    *(undefined4 *)((long)_data + 0x20) = 2;
    _data_local._4_4_ = PHYSFS_ENUM_ERROR;
  }
  else {
    pcVar10 = "";
    if (*(char *)slen != '\0') {
      pcVar10 = "/";
    }
    pcStack_80 = __s;
    *(undefined8 *)(puVar9 + -8) = 0x10a8de;
    snprintf(__s,(size_t)pcVar8,"%s%s%s",sVar4,pcVar10,fname);
    pcVar8 = pcStack_80;
    pcVar2 = *(code **)(puVar1[5] + 0x68);
    uVar3 = *puVar1;
    *(undefined8 *)(puVar9 + -8) = 0x10a8fb;
    iVar5 = (*pcVar2)(uVar3,pcVar8,&trimmedDir);
    if (iVar5 == 0) {
      *(undefined8 *)(puVar9 + -8) = 0x10a905;
      PVar6 = currentErrorCode();
      *(PHYSFS_ErrorCode *)((long)_data + 0x20) = PVar6;
      local_84 = PHYSFS_ENUM_ERROR;
    }
    else if ((int)statbuf.accesstime != 2) {
      pcVar2 = *_data;
      uVar3 = *(undefined8 *)((long)_data + 8);
      *(undefined8 *)(puVar9 + -8) = 0x10a936;
      local_84 = (*pcVar2)(uVar3,origdir,fname);
      if (local_84 == PHYSFS_ENUM_ERROR) {
        *(undefined4 *)((long)_data + 0x20) = 0x1d;
      }
    }
    pcVar8 = pcStack_80;
    *(undefined8 *)(puVar9 + -8) = 0x10a957;
    __PHYSFS_smallFree(pcVar8);
    _data_local._4_4_ = local_84;
  }
  return _data_local._4_4_;
}

Assistant:

static PHYSFS_EnumerateCallbackResult enumCallbackFilterSymLinks(void *_data,
                                    const char *origdir, const char *fname)
{
    SymlinkFilterData *data = (SymlinkFilterData *) _data;
    const DirHandle *dh = data->dirhandle;
    const char *arcfname = data->arcfname;
    PHYSFS_Stat statbuf;
    const char *trimmedDir = (*arcfname == '/') ? (arcfname + 1) : arcfname;
    const size_t slen = strlen(trimmedDir) + strlen(fname) + 2;
    char *path = (char *) __PHYSFS_smallAlloc(slen);
    PHYSFS_EnumerateCallbackResult retval = PHYSFS_ENUM_OK;

    if (path == NULL)
    {
        data->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        return PHYSFS_ENUM_ERROR;
    } /* if */

    snprintf(path, slen, "%s%s%s", trimmedDir, *trimmedDir ? "/" : "", fname);

    if (!dh->funcs->stat(dh->opaque, path, &statbuf))
    {
        data->errcode = currentErrorCode();
        retval = PHYSFS_ENUM_ERROR;
    } /* if */
    else
    {
        /* Pass it on to the application if it's not a symlink. */
        if (statbuf.filetype != PHYSFS_FILETYPE_SYMLINK)
        {
            retval = data->callback(data->callbackData, origdir, fname);
            if (retval == PHYSFS_ENUM_ERROR)
                data->errcode = PHYSFS_ERR_APP_CALLBACK;
        } /* if */
    } /* else */

    __PHYSFS_smallFree(path);

    return retval;
}